

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_448ecb::PostfixQualifiedType::printLeft
          (PostfixQualifiedType *this,OutputStream *s)

{
  char *__src;
  size_t N;
  
  (*this->Ty->_vptr_Node[4])();
  __src = (this->Postfix).First;
  N = (long)(this->Postfix).Last - (long)__src;
  if (N != 0) {
    OutputStream::grow(s,N);
    memmove(s->Buffer + s->CurrentPosition,__src,N);
    s->CurrentPosition = s->CurrentPosition + N;
  }
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    Ty->printLeft(s);
    s += Postfix;
  }